

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int Armor_gone(boolean already_dead)

{
  obj *obj;
  int iVar1;
  
  if (uarm != (obj *)0x0) {
    Oprops_off(uarm,1);
    obj = uarm;
    if (((uarm != (obj *)0x0) && ((ushort)(uarm->otyp - 0x54U) < 0x16)) &&
       (obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr != (char *)0x0)) {
      iVar1 = strncmp(obj_descr[objects[(ushort)uarm->otyp].oc_descr_idx].oc_descr,"gold ",5);
      if (iVar1 == 0) {
        end_burn(obj,'\0');
      }
    }
    Armor_off_sub(already_dead);
    takeoff_mask = takeoff_mask & 0xfffffffe;
    setnotworn(uarm);
    encumber_msg();
    cancelled_don = '\0';
  }
  return 0;
}

Assistant:

int Armor_gone(boolean already_dead)
{
    if (!uarm) return 0;

    Oprops_off(uarm, W_ARM);

    if (uarm && Is_gold_dragon_armor(uarm->otyp))
	end_burn(uarm, FALSE);
    Armor_off_sub(already_dead);
    takeoff_mask &= ~W_ARM;
    setnotworn(uarm);
    encumber_msg();
    cancelled_don = FALSE;
    return 0;
}